

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O2

int memcache_bin_create_request(application_protocol *proto,request *req)

{
  undefined8 *puVar1;
  void *pvVar2;
  ushort uVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long *in_FS_OFFSET;
  double dVar9;
  long lStack_30;
  
  lVar4 = *in_FS_OFFSET;
  in_FS_OFFSET[-0xc] = 0;
  pvVar2 = (void *)(lVar4 + -0x70);
  in_FS_OFFSET[-0xb] = 0;
  in_FS_OFFSET[-0xe] = 0;
  in_FS_OFFSET[-0xd] = 0;
  plVar5 = (long *)proto->arg;
  dVar9 = generate((rand_gen *)plVar5[2]);
  lVar6 = *(long *)(*plVar5 + 0x18);
  puVar1 = (undefined8 *)(lVar6 + (long)(int)dVar9 * 0x10);
  *(undefined1 *)(in_FS_OFFSET + -0xe) = 0x80;
  uVar3 = *(ushort *)(lVar6 + 8 + (long)(int)dVar9 * 0x10);
  *(ushort *)((long)in_FS_OFFSET + -0x6e) = uVar3 << 8 | uVar3 >> 8;
  *(undefined1 *)((long)in_FS_OFFSET + -0x6b) = 0;
  *(undefined2 *)((long)in_FS_OFFSET + -0x6a) = 0;
  dVar9 = drand48();
  if (dVar9 < (double)plVar5[3] || dVar9 == (double)plVar5[3]) {
    *(undefined1 *)((long)in_FS_OFFSET + -0x6f) = 0xc;
    *(undefined1 *)((long)in_FS_OFFSET + -0x6c) = 0;
    uVar8 = *(uint *)(puVar1 + 1);
    *(uint *)(in_FS_OFFSET + -0xd) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    req->iovs[0].iov_base = pvVar2;
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)*puVar1;
    lVar6 = puVar1[1];
    iVar7 = 2;
    lStack_30 = 0x28;
  }
  else {
    dVar9 = generate((rand_gen *)plVar5[1]);
    lVar6 = lround(dVar9);
    if (0x200000 < lVar6) {
      __assert_fail("val_len <= MAX_VAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/memcache.c"
                    ,0xe4,
                    "int memcache_bin_create_request(struct application_protocol *, struct request *)"
                   );
    }
    *(undefined1 *)((long)in_FS_OFFSET + -0x6f) = 1;
    *(undefined1 *)((long)in_FS_OFFSET + -0x6c) = 8;
    uVar8 = *(int *)(puVar1 + 1) + (int)lVar6 + 8;
    *(uint *)(in_FS_OFFSET + -0xd) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 * 0x1000000;
    req->iovs[0].iov_base = pvVar2;
    req->iovs[0].iov_len = 0x18;
    req->iovs[1].iov_base = (void *)(lVar4 + -0x58);
    req->iovs[1].iov_len = 8;
    req->iovs[2].iov_base = (void *)*puVar1;
    req->iovs[2].iov_len = puVar1[1];
    req->iovs[3].iov_base = random_char;
    iVar7 = 4;
    lStack_30 = 0x48;
  }
  *(long *)((long)&((request *)(req->iovs + -1))->meta + lStack_30) = lVar6;
  req->iov_cnt = iVar7;
  return 0;
}

Assistant:

static int memcache_bin_create_request(struct application_protocol *proto,
									   struct request *req)
{
	struct kv_info *info;
	long val_len;
	int key_idx;
	struct iovec *key;

	bzero(&header, sizeof(struct bmc_header));
	extras = 0;

	info = (struct kv_info *)proto->arg;
	key_idx = generate(info->key_sel);
	key = &info->key->keys[key_idx];

	header.magic = 0x80;
	header.key_len = htons(key->iov_len);
	header.data_type = 0x00;
	header.vbucket = 0x00;
	assert(key != NULL);

	if (drand48() > info->get_ratio) {
		// set
		val_len = lround(generate(info->val_len));
		assert(val_len <= MAX_VAL_SIZE);

		header.opcode = CMD_SET;
		header.extra_len = 0x08; // sets have extras for flags and expiration
		header.body_len = htonl(key->iov_len + val_len + header.extra_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = &extras;
		req->iovs[1].iov_len = sizeof(uint64_t);
		req->iovs[2].iov_base = key->iov_base;
		req->iovs[2].iov_len = key->iov_len;
		req->iovs[3].iov_base = random_char;
		req->iovs[3].iov_len = val_len;

		req->iov_cnt = 4;
	} else {
		// get
		header.opcode = CMD_GETK;
		header.extra_len = 0x00;
		header.body_len = htonl(key->iov_len);

		req->iovs[0].iov_base = &header;
		req->iovs[0].iov_len = sizeof(struct bmc_header);
		req->iovs[1].iov_base = key->iov_base;
		req->iovs[1].iov_len = key->iov_len;

		req->iov_cnt = 2;
	}

	return 0;
}